

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuCommandLine.cpp
# Opt level: O0

void __thiscall
tcu::CaseListFilter::CaseListFilter(CaseListFilter *this,CommandLine *cmdLine,Archive *archive)

{
  PtrData<const_tcu::CasePaths,_de::DefaultDeleter<const_tcu::CasePaths>_> data;
  bool bVar1;
  byte bVar2;
  int iVar3;
  ValueType *pVVar4;
  char *pcVar5;
  ValueType *__rhs;
  undefined8 uVar6;
  Resource *pRVar7;
  size_type __n;
  Exception *pEVar8;
  reference pvVar9;
  ulong uVar10;
  ValueType *pVVar11;
  CaseTreeNode *pCVar12;
  MovePtr *this_00;
  ValueType *pathList;
  CasePaths *in_stack_fffffffffffff8d8;
  DefaultDeleter<const_tcu::CasePaths> local_629;
  PtrData<const_tcu::CasePaths,_de::DefaultDeleter<const_tcu::CasePaths>_> local_628;
  PtrData<const_tcu::CasePaths,_de::DefaultDeleter<const_tcu::CasePaths>_> *local_618;
  allocator local_601;
  string local_600 [32];
  istringstream local_5e0 [8];
  istringstream in_1;
  allocator<char> local_459;
  string local_458;
  allocator_type local_431;
  undefined1 local_430 [8];
  vector<char,_std::allocator<char>_> buffer;
  int bufferSize;
  UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> caseListResource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  istream local_3b8 [8];
  ifstream in;
  istringstream local_1b0 [8];
  istringstream str;
  Archive *archive_local;
  CommandLine *cmdLine_local;
  CaseListFilter *this_local;
  
  this->m_caseTree = (CaseTreeNode *)0x0;
  de::details::MovePtr<const_tcu::CasePaths,_de::DefaultDeleter<const_tcu::CasePaths>_>::MovePtr
            (&this->m_casePaths);
  bVar1 = de::cmdline::detail::CommandLine::hasOption<tcu::opt::CaseList>(cmdLine);
  if (bVar1) {
    pVVar4 = de::cmdline::detail::CommandLine::getOption<tcu::opt::CaseList>(cmdLine);
    std::__cxx11::istringstream::istringstream(local_1b0,(string *)pVVar4,_S_in);
    pCVar12 = parseCaseList((istream *)local_1b0);
    this->m_caseTree = pCVar12;
    std::__cxx11::istringstream::~istringstream(local_1b0);
  }
  else {
    bVar1 = de::cmdline::detail::CommandLine::hasOption<tcu::opt::CaseListFile>(cmdLine);
    if (bVar1) {
      de::cmdline::detail::CommandLine::getOption<tcu::opt::CaseListFile>(cmdLine);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(local_3b8,pcVar5,_S_bin);
      bVar2 = std::ifstream::is_open();
      if (((bVar2 & 1) == 0) || (bVar2 = std::ios::good(), (bVar2 & 1) == 0)) {
        caseListResource.super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.m_data.
        _15_1_ = 1;
        pEVar8 = (Exception *)__cxa_allocate_exception(0x30);
        __rhs = de::cmdline::detail::CommandLine::getOption<tcu::opt::CaseListFile>(cmdLine);
        std::operator+(&local_3f8,"Failed to open case list file \'",__rhs);
        std::operator+(&local_3d8,&local_3f8,"\'");
        Exception::Exception(pEVar8,&local_3d8);
        caseListResource.super_UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>.m_data.
        _15_1_ = 0;
        __cxa_throw(pEVar8,&Exception::typeinfo,Exception::~Exception);
      }
      pCVar12 = parseCaseList(local_3b8);
      this->m_caseTree = pCVar12;
      std::ifstream::~ifstream(local_3b8);
    }
    else {
      bVar1 = de::cmdline::detail::CommandLine::hasOption<tcu::opt::CaseListResource>(cmdLine);
      if (bVar1) {
        de::cmdline::detail::CommandLine::getOption<tcu::opt::CaseListResource>(cmdLine);
        uVar6 = std::__cxx11::string::c_str();
        iVar3 = (*archive->_vptr_Archive[2])(archive,uVar6);
        de::DefaultDeleter<tcu::Resource>::DefaultDeleter
                  ((DefaultDeleter<tcu::Resource> *)
                   &buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
        de::details::UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::UniquePtr
                  ((UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)&bufferSize,iVar3
                  );
        pRVar7 = de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::
                 operator->((UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)
                            &bufferSize);
        buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ =
             (*pRVar7->_vptr_Resource[3])();
        __n = (size_type)(int)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
        std::allocator<char>::allocator();
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)local_430,__n,&local_431);
        std::allocator<char>::~allocator(&local_431);
        bVar1 = std::vector<char,_std::allocator<char>_>::empty
                          ((vector<char,_std::allocator<char>_> *)local_430);
        if (bVar1) {
          pEVar8 = (Exception *)__cxa_allocate_exception(0x30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_458,"Empty case list resource",&local_459);
          Exception::Exception(pEVar8,&local_458);
          __cxa_throw(pEVar8,&Exception::typeinfo,Exception::~Exception);
        }
        pRVar7 = de::details::UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::
                 operator->((UniqueBase<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)
                            &bufferSize);
        pvVar9 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)local_430,0);
        (*pRVar7->_vptr_Resource[2])
                  (pRVar7,pvVar9,
                   (ulong)(uint)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                _16_4_);
        pvVar9 = std::vector<char,_std::allocator<char>_>::operator[]
                           ((vector<char,_std::allocator<char>_> *)local_430,0);
        uVar10 = (ulong)(int)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_600,pvVar9,uVar10,&local_601);
        std::__cxx11::istringstream::istringstream(local_5e0,local_600,_S_in);
        std::__cxx11::string::~string(local_600);
        std::allocator<char>::~allocator((allocator<char> *)&local_601);
        pCVar12 = parseCaseList((istream *)local_5e0);
        this->m_caseTree = pCVar12;
        std::__cxx11::istringstream::~istringstream(local_5e0);
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)local_430);
        de::details::UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_>::~UniquePtr
                  ((UniquePtr<tcu::Resource,_de::DefaultDeleter<tcu::Resource>_> *)&bufferSize);
      }
      else {
        pVVar11 = de::cmdline::detail::CommandLine::getOption<tcu::opt::StdinCaseList>(cmdLine);
        if ((*pVVar11 & 1U) == 0) {
          bVar1 = de::cmdline::detail::CommandLine::hasOption<tcu::opt::CasePath>(cmdLine);
          if (bVar1) {
            this_00 = (MovePtr *)operator_new(0x18);
            pathList = de::cmdline::detail::CommandLine::getOption<tcu::opt::CasePath>(cmdLine);
            CasePaths::CasePaths((CasePaths *)this_00,pathList);
            de::DefaultDeleter<const_tcu::CasePaths>::DefaultDeleter(&local_629);
            de::details::MovePtr<const_tcu::CasePaths,_de::DefaultDeleter<const_tcu::CasePaths>_>::
            MovePtr((MovePtr<const_tcu::CasePaths,_de::DefaultDeleter<const_tcu::CasePaths>_> *)
                    &local_628);
            local_618 = de::details::MovePtr::operator_cast_to_PtrData(&local_628,this_00);
            data._8_8_ = local_618;
            data.ptr = in_stack_fffffffffffff8d8;
            de::details::MovePtr<const_tcu::CasePaths,_de::DefaultDeleter<const_tcu::CasePaths>_>::
            operator=(&this->m_casePaths,data);
            de::details::MovePtr<const_tcu::CasePaths,_de::DefaultDeleter<const_tcu::CasePaths>_>::
            ~MovePtr((MovePtr<const_tcu::CasePaths,_de::DefaultDeleter<const_tcu::CasePaths>_> *)
                     &local_628);
          }
        }
        else {
          pCVar12 = parseCaseList((istream *)&std::cin);
          this->m_caseTree = pCVar12;
        }
      }
    }
  }
  return;
}

Assistant:

CaseListFilter::CaseListFilter (const de::cmdline::CommandLine& cmdLine, const tcu::Archive& archive)
	: m_caseTree(DE_NULL)
{
	if (cmdLine.hasOption<opt::CaseList>())
	{
		std::istringstream str(cmdLine.getOption<opt::CaseList>());

		m_caseTree = parseCaseList(str);
	}
	else if (cmdLine.hasOption<opt::CaseListFile>())
	{
		std::ifstream in(cmdLine.getOption<opt::CaseListFile>().c_str(), std::ios_base::binary);

		if (!in.is_open() || !in.good())
			throw Exception("Failed to open case list file '" + cmdLine.getOption<opt::CaseListFile>() + "'");

		m_caseTree = parseCaseList(in);
	}
	else if (cmdLine.hasOption<opt::CaseListResource>())
	{
		// \todo [2016-11-14 pyry] We are cloning potentially large buffers here. Consider writing
		//						   istream adaptor for tcu::Resource.
		de::UniquePtr<Resource>	caseListResource	(archive.getResource(cmdLine.getOption<opt::CaseListResource>().c_str()));
		const int				bufferSize			= caseListResource->getSize();
		std::vector<char>		buffer				((size_t)bufferSize);

		if (buffer.empty())
			throw Exception("Empty case list resource");

		caseListResource->read(reinterpret_cast<deUint8*>(&buffer[0]), bufferSize);

		{
			std::istringstream	in	(std::string(&buffer[0], (size_t)bufferSize));

			m_caseTree = parseCaseList(in);
		}
	}
	else if (cmdLine.getOption<opt::StdinCaseList>())
	{
		m_caseTree = parseCaseList(std::cin);
	}
	else if (cmdLine.hasOption<opt::CasePath>())
		m_casePaths = de::MovePtr<const CasePaths>(new CasePaths(cmdLine.getOption<opt::CasePath>()));
}